

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::CFG::node_terminates_control_flow_in_sub_graph
          (CFG *this,BlockID from,BlockID to)

{
  int iVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  uint32_t uVar4;
  bool bVar5;
  SPIRBlock *pSVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  ulong uVar10;
  SPIRBlock *pSVar11;
  SPIRBlock *from_00;
  SPIRBlock *to_00;
  ulong uVar12;
  __node_base_ptr p_Var13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  DominatorBuilder builder;
  DominatorBuilder local_40;
  
  pSVar6 = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                      from.id);
  bVar15 = to.id == from.id;
  if (bVar15) {
    return bVar15;
  }
  uVar7 = (ulong)(pSVar6->merge_block).id;
  if (pSVar6->merge != MergeLoop) {
    uVar7 = 0;
  }
  do {
    uVar10 = (this->preceding_edges)._M_h._M_bucket_count;
    uVar12 = (ulong)to.id % uVar10;
    p_Var2 = (this->preceding_edges)._M_h._M_buckets[uVar12];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var8 = p_Var2, p_Var13 = p_Var2->_M_nxt, to.id != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
      while (p_Var9 = p_Var13->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar10 != uVar12) ||
           (p_Var8 = p_Var13, p_Var13 = p_Var9, to.id == *(uint *)&p_Var9[1]._M_nxt))
        goto LAB_0034ce3b;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_0034ce3b:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var9 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var9 = p_Var8->_M_nxt;
    }
    if (p_Var9 == (_Hash_node_base *)0x0) {
      return bVar15;
    }
    local_40.dominator = 0;
    p_Var3 = p_Var9[3]._M_nxt;
    local_40.cfg = this;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      p_Var9 = p_Var9[2]._M_nxt;
      lVar14 = 0;
      do {
        DominatorBuilder::add_block(&local_40,*(uint32_t *)((long)&p_Var9->_M_nxt + lVar14));
        lVar14 = lVar14 + 4;
      } while ((long)p_Var3 << 2 != lVar14);
    }
    uVar4 = local_40.dominator;
    if ((ulong)local_40.dominator == 0) {
      return bVar15;
    }
    pSVar6 = Variant::get<diligent_spirv_cross::SPIRBlock>
                       ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
                        + local_40.dominator);
    bVar5 = true;
    bVar16 = true;
    if (pSVar6->merge != MergeNone) {
      if ((pSVar6->merge == MergeSelection) &&
         (uVar10 = (ulong)(pSVar6->next_block).id, uVar10 != 0)) {
        pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                            ((this->compiler->ir).ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar10);
        bVar16 = true;
        if (*(int *)&(pSVar11->super_IVariant).field_0xc == 5) goto LAB_0034cf28;
      }
      if ((pSVar6->merge == MergeLoop) && (uVar10 = (ulong)(pSVar6->merge_block).id, uVar10 != 0)) {
        pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                            ((this->compiler->ir).ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar10);
        bVar16 = *(int *)&(pSVar11->super_IVariant).field_0xc == 5;
      }
      else {
        bVar16 = false;
      }
    }
LAB_0034cf28:
    if ((((pSVar6->super_IVariant).self.id == from.id) || (bVar16)) && (uVar7 != 0)) {
      bVar16 = true;
      if (*(int *)&(pSVar6->super_IVariant).field_0xc == 2) {
        pSVar11 = Variant::get<diligent_spirv_cross::SPIRBlock>
                            ((this->compiler->ir).ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             (pSVar6->true_block).id);
        from_00 = Variant::get<diligent_spirv_cross::SPIRBlock>
                            ((this->compiler->ir).ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             (pSVar6->false_block).id);
        to_00 = Variant::get<diligent_spirv_cross::SPIRBlock>
                          ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                           ptr + uVar7);
        bVar16 = Compiler::execution_is_branchless(this->compiler,pSVar11,to_00);
        bVar5 = Compiler::execution_is_branchless(this->compiler,from_00,to_00);
        bVar5 = !bVar5;
        bVar16 = !bVar16;
      }
    }
    else {
      bVar16 = true;
    }
    if ((((pSVar6->merge != MergeSelection) || ((pSVar6->next_block).id != to.id)) &&
        ((pSVar6->merge != MergeLoop || ((pSVar6->merge_block).id != to.id)))) &&
       ((iVar1 = *(int *)&(pSVar6->super_IVariant).field_0xc, iVar1 != 1 ||
        ((pSVar6->next_block).id != to.id)))) {
      if (iVar1 != 2) {
        return bVar15;
      }
      if ((!(bool)(~bVar5 & (pSVar6->true_block).id == to.id)) &&
         (bVar16 || (pSVar6->false_block).id != to.id)) {
        return bVar15;
      }
    }
    bVar15 = uVar4 == from.id;
    to.id = uVar4;
    if (bVar15) {
      return bVar15;
    }
  } while( true );
}

Assistant:

bool CFG::node_terminates_control_flow_in_sub_graph(BlockID from, BlockID to) const
{
	// Walk backwards, starting from "to" block.
	// Only follow pred edges if they have a 1:1 relationship, or a merge relationship.
	// If we cannot find a path to "from", we must assume that to is inside control flow in some way.

	auto &from_block = compiler.get<SPIRBlock>(from);
	BlockID ignore_block_id = 0;
	if (from_block.merge == SPIRBlock::MergeLoop)
		ignore_block_id = from_block.merge_block;

	while (to != from)
	{
		auto pred_itr = preceding_edges.find(to);
		if (pred_itr == end(preceding_edges))
			return false;

		DominatorBuilder builder(*this);
		for (auto &edge : pred_itr->second)
			builder.add_block(edge);

		uint32_t dominator = builder.get_dominator();
		if (dominator == 0)
			return false;

		auto &dom = compiler.get<SPIRBlock>(dominator);

		bool true_path_ignore = false;
		bool false_path_ignore = false;

		bool merges_to_nothing = dom.merge == SPIRBlock::MergeNone ||
		                         (dom.merge == SPIRBlock::MergeSelection && dom.next_block &&
		                          compiler.get<SPIRBlock>(dom.next_block).terminator == SPIRBlock::Unreachable) ||
		                         (dom.merge == SPIRBlock::MergeLoop && dom.merge_block &&
		                          compiler.get<SPIRBlock>(dom.merge_block).terminator == SPIRBlock::Unreachable);

		if (dom.self == from || merges_to_nothing)
		{
			// We can only ignore inner branchy paths if there is no merge,
			// i.e. no code is generated afterwards. E.g. this allows us to elide continue:
			// for (;;) { if (cond) { continue; } else { break; } }.
			// Codegen here in SPIR-V will be something like either no merge if one path directly breaks, or
			// we merge to Unreachable.
			if (ignore_block_id && dom.terminator == SPIRBlock::Select)
			{
				auto &true_block = compiler.get<SPIRBlock>(dom.true_block);
				auto &false_block = compiler.get<SPIRBlock>(dom.false_block);
				auto &ignore_block = compiler.get<SPIRBlock>(ignore_block_id);
				true_path_ignore = compiler.execution_is_branchless(true_block, ignore_block);
				false_path_ignore = compiler.execution_is_branchless(false_block, ignore_block);
			}
		}

		// Cases where we allow traversal. This serves as a proxy for post-dominance in a loop body.
		// TODO: Might want to do full post-dominance analysis, but it's a lot of churn for something like this ...
		// - We're the merge block of a selection construct. Jump to header.
		// - We're the merge block of a loop. Jump to header.
		// - Direct branch. Trivial.
		// - Allow cases inside a branch if the header cannot merge execution before loop exit.
		if ((dom.merge == SPIRBlock::MergeSelection && dom.next_block == to) ||
		    (dom.merge == SPIRBlock::MergeLoop && dom.merge_block == to) ||
		    (dom.terminator == SPIRBlock::Direct && dom.next_block == to) ||
		    (dom.terminator == SPIRBlock::Select && dom.true_block == to && false_path_ignore) ||
		    (dom.terminator == SPIRBlock::Select && dom.false_block == to && true_path_ignore))
		{
			// Allow walking selection constructs if the other branch reaches out of a loop construct.
			// It cannot be in-scope anymore.
			to = dominator;
		}
		else
			return false;
	}

	return true;
}